

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_resize.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ListResizeBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  vector<duckdb::LogicalType,_true> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  undefined1 auVar3 [8];
  element_type *peVar4;
  _Alloc_hider _Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  reference pvVar9;
  reference pvVar10;
  pointer pEVar11;
  undefined8 *puVar12;
  LogicalType *pLVar13;
  pointer *__ptr;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined1 local_78 [8];
  undefined8 local_70;
  _Alloc_hider _Stack_68;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  LogicalType local_48;
  
  LogicalType::LogicalType((LogicalType *)local_78,UBIGINT);
  this_00 = &(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments;
  pvVar9 = vector<duckdb::LogicalType,_true>::operator[](this_00,1);
  _Var5._M_p = _Stack_68._M_p;
  peVar4 = local_70;
  pvVar9->id_ = local_78[0];
  pvVar9->physical_type_ = local_78[1];
  uVar14 = *(undefined4 *)
            &(pvVar9->type_info_).internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar15 = *(undefined4 *)
            ((long)&(pvVar9->type_info_).internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4
            );
  uVar16 = *(undefined4 *)
            &(pvVar9->type_info_).internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  uVar17 = *(undefined4 *)
            ((long)&(pvVar9->type_info_).internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi + 4);
  (pvVar9->type_info_).internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (pvVar9->type_info_).internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_70 = (element_type *)0x0;
  _Stack_68._M_p = (pointer)0x0;
  p_Var1 = (pvVar9->type_info_).internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (pvVar9->type_info_).internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
  (pvVar9->type_info_).internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var5._M_p;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_58._M_allocated_capacity._0_4_ = uVar14;
    local_58._M_allocated_capacity._4_4_ = uVar15;
    local_58._8_4_ = uVar16;
    local_58._12_4_ = uVar17;
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    uVar14 = local_58._M_allocated_capacity._0_4_;
    uVar15 = local_58._M_allocated_capacity._4_4_;
    uVar16 = local_58._8_4_;
    uVar17 = local_58._12_4_;
  }
  _Var5._M_p = _Stack_68._M_p;
  local_70 = (element_type *)CONCAT44(uVar15,uVar14);
  _Stack_68._M_p._4_4_ = uVar17;
  _Stack_68._M_p._0_4_ = uVar16;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var5._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var5._M_p);
  }
  LogicalType::~LogicalType((LogicalType *)local_78);
  pvVar10 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](arguments,0);
  local_60._M_head_impl =
       (pvVar10->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
       _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pvVar10->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  BoundCastExpression::AddArrayCastToList
            ((BoundCastExpression *)local_78,context,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_60);
  pvVar10 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](arguments,0);
  auVar3 = local_78;
  local_78 = (undefined1  [8])0x0;
  _Var2._M_head_impl =
       (pvVar10->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
       _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pvVar10->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)auVar3;
  if (_Var2._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))();
  }
  if (local_78 != (undefined1  [8])0x0) {
    (**(code **)(*(_func_int **)local_78 + 8))();
  }
  local_78 = (undefined1  [8])0x0;
  if (local_60._M_head_impl != (Expression *)0x0) {
    (*((local_60._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_60._M_head_impl = (Expression *)0x0;
  pvVar10 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](arguments,0);
  pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar10);
  LogicalType::LogicalType((LogicalType *)local_78,SQLNULL);
  bVar6 = LogicalType::operator==(&pEVar11->return_type,(LogicalType *)local_78);
  LogicalType::~LogicalType((LogicalType *)local_78);
  if (bVar6) {
    LogicalType::LogicalType((LogicalType *)local_78,SQLNULL);
    pvVar9 = vector<duckdb::LogicalType,_true>::operator[](this_00,0);
    _Var5._M_p = _Stack_68._M_p;
    peVar4 = local_70;
    pvVar9->id_ = local_78[0];
    pvVar9->physical_type_ = local_78[1];
    uVar14 = *(undefined4 *)
              &(pvVar9->type_info_).internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar15 = *(undefined4 *)
              ((long)&(pvVar9->type_info_).internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
              4);
    uVar16 = *(undefined4 *)
              &(pvVar9->type_info_).internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
    uVar17 = *(undefined4 *)
              ((long)&(pvVar9->type_info_).internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 4);
    (pvVar9->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pvVar9->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_70 = (element_type *)0x0;
    _Stack_68._M_p = (pointer)0x0;
    p_Var1 = (pvVar9->type_info_).internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    (pvVar9->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
    (pvVar9->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var5._M_p;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_58._M_allocated_capacity._0_4_ = uVar14;
      local_58._M_allocated_capacity._4_4_ = uVar15;
      local_58._8_4_ = uVar16;
      local_58._12_4_ = uVar17;
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      uVar14 = local_58._M_allocated_capacity._0_4_;
      uVar15 = local_58._M_allocated_capacity._4_4_;
      uVar16 = local_58._8_4_;
      uVar17 = local_58._12_4_;
    }
    _Var5._M_p = _Stack_68._M_p;
    local_70 = (element_type *)CONCAT44(uVar15,uVar14);
    _Stack_68._M_p._4_4_ = uVar17;
    _Stack_68._M_p._0_4_ = uVar16;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var5._M_p !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var5._M_p);
    }
    LogicalType::~LogicalType((LogicalType *)local_78);
    LogicalType::LogicalType((LogicalType *)local_78,SQLNULL);
    _Var5._M_p = _Stack_68._M_p;
    peVar4 = local_70;
    (bound_function->super_BaseScalarFunction).return_type.id_ = local_78[0];
    (bound_function->super_BaseScalarFunction).return_type.physical_type_ = local_78[1];
    uVar14 = *(undefined4 *)
              &(bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar15 = *(undefined4 *)
              ((long)&(bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
              4);
    uVar16 = *(undefined4 *)
              &(bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
    uVar17 = *(undefined4 *)
              ((long)&(bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 4);
    (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_70 = (element_type *)0x0;
    _Stack_68._M_p = (pointer)0x0;
    p_Var1 = (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
    (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var5._M_p;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_58._M_allocated_capacity._0_4_ = uVar14;
      local_58._M_allocated_capacity._4_4_ = uVar15;
      local_58._8_4_ = uVar16;
      local_58._12_4_ = uVar17;
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      uVar14 = local_58._M_allocated_capacity._0_4_;
      uVar15 = local_58._M_allocated_capacity._4_4_;
      uVar16 = local_58._8_4_;
      uVar17 = local_58._12_4_;
    }
    _Var5._M_p = _Stack_68._M_p;
    local_70 = (element_type *)CONCAT44(uVar15,uVar14);
    _Stack_68._M_p._4_4_ = uVar17;
    _Stack_68._M_p._0_4_ = uVar16;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var5._M_p !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var5._M_p);
    }
    LogicalType::~LogicalType((LogicalType *)local_78);
    puVar12 = (undefined8 *)operator_new(0x20);
    LogicalType::LogicalType
              ((LogicalType *)local_78,&(bound_function->super_BaseScalarFunction).return_type);
  }
  else {
    pvVar10 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              ::operator[](arguments,0);
    pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(pvVar10);
    LogicalType::LogicalType((LogicalType *)local_78,UNKNOWN);
    bVar6 = LogicalType::operator==(&pEVar11->return_type,(LogicalType *)local_78);
    LogicalType::~LogicalType((LogicalType *)local_78);
    if (bVar6) {
      pvVar10 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::operator[](arguments,0);
      pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(pvVar10);
      pLVar13 = &(bound_function->super_BaseScalarFunction).return_type;
      if (pLVar13 != &pEVar11->return_type) {
        (bound_function->super_BaseScalarFunction).return_type.id_ = (pEVar11->return_type).id_;
        (bound_function->super_BaseScalarFunction).return_type.physical_type_ =
             (pEVar11->return_type).physical_type_;
        shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                  (&(bound_function->super_BaseScalarFunction).return_type.type_info_,
                   &(pEVar11->return_type).type_info_);
      }
      puVar12 = (undefined8 *)operator_new(0x20);
      LogicalType::LogicalType((LogicalType *)local_78,pLVar13);
    }
    else {
      bVar6 = false;
      if ((long)(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_start == 0x48) {
        pvVar10 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  ::operator[](arguments,0);
        pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(pvVar10);
        pLVar13 = ListType::GetChildType(&pEVar11->return_type);
        pvVar10 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  ::operator[](arguments,2);
        pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(pvVar10);
        bVar7 = LogicalType::operator==(pLVar13,&pEVar11->return_type);
        bVar8 = false;
        bVar6 = false;
        if (!bVar7) {
          pvVar10 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    ::operator[](arguments,2);
          pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->(pvVar10);
          LogicalType::LogicalType(&local_48,SQLNULL);
          bVar8 = LogicalType::operator==(&pEVar11->return_type,&local_48);
          bVar8 = !bVar8;
          bVar6 = true;
        }
      }
      else {
        bVar8 = false;
      }
      if (bVar6) {
        LogicalType::~LogicalType(&local_48);
      }
      if (bVar8) {
        pvVar10 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  ::operator[](arguments,0);
        pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(pvVar10);
        pLVar13 = ListType::GetChildType(&pEVar11->return_type);
        pvVar9 = vector<duckdb::LogicalType,_true>::operator[](this_00,2);
        if (pvVar9 != pLVar13) {
          pvVar9->id_ = pLVar13->id_;
          pvVar9->physical_type_ = pLVar13->physical_type_;
          shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                    (&pvVar9->type_info_,&pLVar13->type_info_);
        }
      }
      pvVar10 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::operator[](arguments,0);
      pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(pvVar10);
      pLVar13 = &(bound_function->super_BaseScalarFunction).return_type;
      if (pLVar13 != &pEVar11->return_type) {
        (bound_function->super_BaseScalarFunction).return_type.id_ = (pEVar11->return_type).id_;
        (bound_function->super_BaseScalarFunction).return_type.physical_type_ =
             (pEVar11->return_type).physical_type_;
        shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                  (&(bound_function->super_BaseScalarFunction).return_type.type_info_,
                   &(pEVar11->return_type).type_info_);
      }
      puVar12 = (undefined8 *)operator_new(0x20);
      LogicalType::LogicalType((LogicalType *)local_78,pLVar13);
    }
  }
  *puVar12 = &PTR__VariableReturnBindData_0247f968;
  LogicalType::LogicalType((LogicalType *)(puVar12 + 1),(LogicalType *)local_78);
  LogicalType::~LogicalType((LogicalType *)local_78);
  *(undefined8 **)this = puVar12;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> ListResizeBind(ClientContext &context, ScalarFunction &bound_function,
                                               vector<unique_ptr<Expression>> &arguments) {
	D_ASSERT(bound_function.arguments.size() == 2 || arguments.size() == 3);
	bound_function.arguments[1] = LogicalType::UBIGINT;

	// If the first argument is an array, cast it to a list.
	arguments[0] = BoundCastExpression::AddArrayCastToList(context, std::move(arguments[0]));

	// Early-out, if the first argument is a constant NULL.
	if (arguments[0]->return_type == LogicalType::SQLNULL) {
		bound_function.arguments[0] = LogicalType::SQLNULL;
		bound_function.return_type = LogicalType::SQLNULL;
		return make_uniq<VariableReturnBindData>(bound_function.return_type);
	}

	// Early-out, if the first argument is a prepared statement.
	if (arguments[0]->return_type == LogicalType::UNKNOWN) {
		bound_function.return_type = arguments[0]->return_type;
		return make_uniq<VariableReturnBindData>(bound_function.return_type);
	}

	// Attempt implicit casting, if the default type does not match list the list child type.
	if (bound_function.arguments.size() == 3 &&
	    ListType::GetChildType(arguments[0]->return_type) != arguments[2]->return_type &&
	    arguments[2]->return_type != LogicalTypeId::SQLNULL) {
		bound_function.arguments[2] = ListType::GetChildType(arguments[0]->return_type);
	}

	bound_function.return_type = arguments[0]->return_type;
	return make_uniq<VariableReturnBindData>(bound_function.return_type);
}